

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O1

void google::protobuf::internal::InitShutdownFunctions(void)

{
  undefined8 *puVar1;
  pthread_mutex_t *__mutex;
  
  shutdown_functions = (undefined8 *)operator_new(0x18);
  *shutdown_functions = 0;
  shutdown_functions[1] = 0;
  shutdown_functions[2] = 0;
  puVar1 = (undefined8 *)operator_new(8);
  __mutex = (pthread_mutex_t *)operator_new(0x28);
  *puVar1 = __mutex;
  pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
  shutdown_functions_mutex = puVar1;
  return;
}

Assistant:

void InitShutdownFunctions() {
  shutdown_functions = new vector<void (*)()>;
  shutdown_functions_mutex = new Mutex;
}